

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

ConcurrentAssertionStatementSyntax * __thiscall
slang::parsing::Parser::parseConcurrentAssertion
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  bool bVar1;
  TokenKind TVar2;
  PropertySpecSyntax *propertySpec;
  ActionBlockSyntax *action;
  ConcurrentAssertionStatementSyntax *pCVar3;
  logic_error *this_00;
  long *plVar4;
  size_type sVar5;
  size_type *psVar6;
  long *plVar7;
  _func_int **pp_Var8;
  pointer ppAVar9;
  Token TVar10;
  Token closeParen;
  Token keyword;
  Token local_160;
  SyntaxKind local_14c;
  pointer local_148;
  size_type local_140;
  Info *local_138;
  undefined8 local_130;
  NamedLabelSyntax *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Token local_100;
  Token local_f0;
  undefined1 local_e0 [16];
  _func_int *local_d0;
  size_type sStack_c8;
  pointer local_c0;
  size_type local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar5 = attributes.size_;
  ppAVar9 = attributes.data_;
  Token::Token(&local_160);
  TVar10 = ParserBase::consume(&this->super_ParserBase);
  local_138 = TVar10.info;
  local_130 = TVar10._0_8_;
  TVar2 = TVar10.kind;
  local_148 = ppAVar9;
  local_140 = sVar5;
  local_128 = label;
  if (TVar2 < CoverKeyword) {
    if (TVar2 == AssertKeyword) {
      local_160 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      TVar10.info = local_138;
      TVar10.kind = (undefined2)local_130;
      TVar10._2_1_ = local_130._2_1_;
      TVar10.numFlags.raw = local_130._3_1_;
      TVar10.rawLen = local_130._4_4_;
      local_14c = AssertPropertyStatement;
    }
    else {
      if (TVar2 != AssumeKeyword) {
LAB_0033a66f:
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Parser_statements.cpp"
                   ,"");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
        local_120._M_dataplus._M_p = (pointer)*plVar4;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_120._M_dataplus._M_p == psVar6) {
          local_120.field_2._M_allocated_capacity = *psVar6;
          local_120.field_2._8_8_ = plVar4[3];
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar6;
        }
        local_120._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::to_string(&local_70,0x240);
        std::operator+(&local_50,&local_120,&local_70);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_b0 = (long *)*plVar4;
        plVar7 = plVar4 + 2;
        if (local_b0 == plVar7) {
          local_a0 = *plVar7;
          lStack_98 = plVar4[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar7;
        }
        local_a8 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_e0._0_8_ = *plVar4;
        pp_Var8 = (_func_int **)(plVar4 + 2);
        if ((_func_int **)local_e0._0_8_ == pp_Var8) {
          local_d0 = *pp_Var8;
          sStack_c8 = plVar4[3];
          local_e0._0_8_ = &local_d0;
        }
        else {
          local_d0 = *pp_Var8;
        }
        local_e0._8_8_ = plVar4[1];
        *plVar4 = (long)pp_Var8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::logic_error::logic_error(this_00,(string *)local_e0);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_160 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      TVar10.info = local_138;
      TVar10.kind = (undefined2)local_130;
      TVar10._2_1_ = local_130._2_1_;
      TVar10.numFlags.raw = local_130._3_1_;
      TVar10.rawLen = local_130._4_4_;
      local_14c = AssumePropertyStatement;
    }
  }
  else if (TVar2 == CoverKeyword) {
    bVar1 = ParserBase::peek(&this->super_ParserBase,SequenceKeyword);
    if (bVar1) {
      local_160 = ParserBase::consume(&this->super_ParserBase);
      TVar10.info = local_138;
      TVar10.kind = (undefined2)local_130;
      TVar10._2_1_ = local_130._2_1_;
      TVar10.numFlags.raw = local_130._3_1_;
      TVar10.rawLen = local_130._4_4_;
      local_14c = CoverSequenceStatement;
    }
    else {
      local_160 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      TVar10.info = local_138;
      TVar10.kind = (undefined2)local_130;
      TVar10._2_1_ = local_130._2_1_;
      TVar10.numFlags.raw = local_130._3_1_;
      TVar10.rawLen = local_130._4_4_;
      local_14c = CoverPropertyStatement;
    }
  }
  else {
    local_14c = ExpectPropertyStatement;
    if (TVar2 != ExpectKeyword) {
      if (TVar2 != RestrictKeyword) goto LAB_0033a66f;
      local_160 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      TVar10.info = local_138;
      TVar10.kind = (undefined2)local_130;
      TVar10._2_1_ = local_130._2_1_;
      TVar10.numFlags.raw = local_130._3_1_;
      TVar10.rawLen = local_130._4_4_;
      local_14c = RestrictPropertyStatement;
    }
  }
  local_138 = TVar10.info;
  local_130 = TVar10._0_8_;
  TVar10 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  propertySpec = parsePropertySpec(this);
  closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  action = parseActionBlock(this);
  local_e0._8_8_ = (SyntaxNode *)0x0;
  local_d0 = (_func_int *)CONCAT44(local_d0._4_4_,SyntaxList);
  sStack_c8 = local_140;
  local_c0 = local_148;
  local_b8 = local_140;
  local_e0._0_8_ = &PTR_getChild_004ea348;
  keyword.info = local_138;
  keyword.kind = (undefined2)local_130;
  keyword._2_1_ = local_130._2_1_;
  keyword.numFlags.raw = local_130._3_1_;
  keyword.rawLen = local_130._4_4_;
  local_100 = closeParen;
  local_f0 = TVar10;
  pCVar3 = slang::syntax::SyntaxFactory::concurrentAssertionStatement
                     (&this->factory,local_14c,local_128,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_e0,keyword,
                      local_160,TVar10,propertySpec,closeParen,action);
  return pCVar3;
}

Assistant:

ConcurrentAssertionStatementSyntax& Parser::parseConcurrentAssertion(NamedLabelSyntax* label,
                                                                     AttrList attributes) {

    SyntaxKind kind = SyntaxKind::Unknown;
    Token propertyOrSequence;
    auto keyword = consume();

    switch (keyword.kind) {
        case TokenKind::AssertKeyword:
            kind = SyntaxKind::AssertPropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::AssumeKeyword:
            kind = SyntaxKind::AssumePropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::CoverKeyword:
            if (peek(TokenKind::SequenceKeyword)) {
                kind = SyntaxKind::CoverSequenceStatement;
                propertyOrSequence = consume();
            }
            else {
                kind = SyntaxKind::CoverPropertyStatement;
                propertyOrSequence = expect(TokenKind::PropertyKeyword);
            }
            break;
        case TokenKind::RestrictKeyword:
            kind = SyntaxKind::RestrictPropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::ExpectKeyword:
            kind = SyntaxKind::ExpectPropertyStatement;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& spec = parsePropertySpec();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& action = parseActionBlock();

    return factory.concurrentAssertionStatement(kind, label, attributes, keyword,
                                                propertyOrSequence, openParen, spec, closeParen,
                                                action);
}